

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::skipPastNextOccurrenceOf(Parser *this,TokenType token)

{
  bool bVar1;
  Parser *this_local;
  TokenType token_local;
  
  while (bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ::matchIf<soul::TokenType>
                           (&this->
                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ,token), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)"{");
    if (bVar1) {
      skipPastNextOccurrenceOf(this,(TokenType)0x54ceac);
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)"$eof");
      if (bVar1) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,token);
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
    }
  }
  return;
}

Assistant:

void skipPastNextOccurrenceOf (TokenType token)
    {
        while (! matchIf (token))
        {
            if (matchIf (HEARTOperator::openBrace))
            {
                skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
                continue;
            }

            if (matches (Token::eof))
                expect (token);

            skip();
        }
    }